

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallString.h
# Opt level: O1

char * __thiscall llvm::SmallString<256U>::c_str(SmallString<256U> *this)

{
  ulong uVar1;
  char local_9;
  
  local_9 = '\0';
  SmallVectorTemplateBase<char,_true>::push_back
            ((SmallVectorTemplateBase<char,_true> *)this,&local_9);
  uVar1 = (ulong)(this->super_SmallVector<char,_256U>).super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - 1;
  if (uVar1 <= (this->super_SmallVector<char,_256U>).super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Capacity) {
    (this->super_SmallVector<char,_256U>).super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)uVar1;
    return (char *)(this->super_SmallVector<char,_256U>).super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

const char* c_str() {
    this->push_back(0);
    this->pop_back();
    return this->data();
  }